

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bboptions.c
# Opt level: O3

int bb_options_get(bb_options_t *options,int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  ulong in_RAX;
  undefined8 in_R9;
  int option_index;
  
  options->no_suppliers = 1;
  options->no_consumers = 1;
  options->supplier_max_delay_ms = 300;
  options->consumer_max_delay_ms = 1000;
  options->gen_count = 2000;
  options->bsize = 100;
LAB_00101b42:
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          in_RAX = in_RAX & 0xffffffff;
          uVar1 = getopt_long(argc,argv,"",bb_options_get::long_options,&stack0xffffffffffffffcc,
                              in_R9,in_RAX);
          if (0x72 < (int)uVar1) break;
          switch(uVar1) {
          case 0x62:
            iVar2 = atoi(_optarg);
            options->bsize = iVar2;
            break;
          case 99:
            iVar2 = atoi(_optarg);
            options->no_consumers = iVar2;
            break;
          case 100:
          case 0x65:
          case 0x66:
            goto switchD_00101b78_caseD_64;
          case 0x67:
            iVar2 = atoi(_optarg);
            options->gen_count = iVar2;
            break;
          case 0x68:
            bb_options_get_cold_1();
          default:
            goto switchD_00101b78_default;
          }
        }
        if (uVar1 != 0x73) break;
        iVar2 = atoi(_optarg);
        options->no_suppliers = iVar2;
      }
      if (uVar1 != 0x78) break;
      iVar2 = atoi(_optarg);
      options->supplier_max_delay_ms = iVar2;
    }
    if (uVar1 != 0x79) break;
    iVar2 = atoi(_optarg);
    options->consumer_max_delay_ms = iVar2;
  }
  goto switchD_00101b78_caseD_64;
switchD_00101b78_default:
  if (uVar1 != 0x3f) {
    if (uVar1 == 0xffffffff) {
      return uVar1;
    }
switchD_00101b78_caseD_64:
    printf("?? getopt returned character code 0%o ??\n",(ulong)uVar1);
  }
  goto LAB_00101b42;
}

Assistant:

int bb_options_get(bb_options_t* options, int argc, char **argv)
{
    int c;
    int digit_optind = 0;

    options->no_suppliers = NUM_SUPPLIERS;
    options->no_consumers = NUM_CONSUMERS;
    options->supplier_max_delay_ms = SUPPLIER_DELAY;
    options->consumer_max_delay_ms = CONSUMER_DELAY;
    options->gen_count = GEN_COUNT;
    options->bsize = BB_SIZE;

    while (1)
    {
        int this_option_optind = optind ? optind : 1;
        int option_index = 0;
        static struct option long_options[] =
        {
            {"suppliers", required_argument, 0, 's' },
            {"consumers", required_argument, 0, 'c' },
            {"sdelay",    required_argument, 0, 'x' },
            {"cdelay",    required_argument, 0, 'y' },
            {"gen",       required_argument, 0, 'g' },
            {"bsize",     required_argument, 0, 'b' },
            {"help",     no_argument, 0, 'h' },
            {0,         0,                 0,  0 }
        };

        c = getopt_long(argc, argv, "",
                        long_options, &option_index);
        if (c == -1)
            break;

        switch (c)
        {
        case 'b':
            options->bsize = atoi(optarg);
            break;

        case 's':
            options->no_suppliers = atoi(optarg);
            break;

        case 'c':
            options->no_consumers = atoi(optarg);
            break;

        case 'x':
            options->supplier_max_delay_ms = atoi(optarg);
            break;

        case 'y':
            options->consumer_max_delay_ms = atoi(optarg);
            break;

        case 'g':
            options->gen_count = atoi(optarg);
            break;

        case 'h':
            fprintf(stderr, "usage: %s [--suppliers SUPPLIERS] [--consumers CONSUMERS] [--sdelay SDELAY] [--cdelay CDELAY]  [--gen GEN]  [--bsize BSIZE]\n", argv[0]);
            fprintf(stderr, "\tSUPPLIERS is number of suppliers (default:  %d)\n", NUM_SUPPLIERS);
            fprintf(stderr, "\tCONSUMERS is number of suppliers (default:  %d)\n", NUM_CONSUMERS);
            fprintf(stderr, "\tSDELAY is max random delay in millisconds (default: %d)\n", SUPPLIER_DELAY);
            fprintf(stderr, "\tCDELAY is max random delay in millisconds (default: %d)\n", CONSUMER_DELAY);
            fprintf(stderr, "\tBSIZE is bounded buffer size (default: %d)\n", BB_SIZE);
            fprintf(stderr, "\tGEN number of messages to generate per supplier (default: %d)\n", GEN_COUNT);
            exit(0);
            break;

        case '?':
            break;

        default:
            printf("?? getopt returned character code 0%o ??\n", c);
        }
    }

    /*
     * Save these notes from GNU man page.
    if (optind < argc) {
      printf("non-option ARGV-elements: ");
      while (optind < argc)
        printf("%s ", argv[optind++]);
      printf("\n");
    }
    */

}